

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpExtensions.cpp
# Opt level: O1

void __thiscall
GrpTokenStreamFilter::ReportLexerError(GrpTokenStreamFilter *this,ScannerException *ex)

{
  int iVar1;
  pointer pcVar2;
  int iVar3;
  long *local_88;
  long local_80;
  long local_78 [2];
  string local_68;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  iVar3 = (**(code **)(*(long *)&ex->super_ANTLRException + 0x30))(ex);
  iVar1 = this->m_nLineOffset;
  (**(code **)(*(long *)&ex->super_ANTLRException + 0x28))(&local_68,ex);
  pcVar2 = (this->m_staFile)._M_dataplus._M_p;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + (this->m_staFile)._M_string_length);
  local_48._4_4_ = iVar1 + iVar3;
  local_48._0_4_ = iVar3;
  local_40._M_p = (pointer)&local_30;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,local_88,local_80 + (long)local_88);
  AddGlobalError(true,0x65,&local_68,(GrpLineAndFile *)local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GrpTokenStreamFilter::ReportLexerError(const ScannerException & ex)
{
	int nLinePre = ex.getLine();
	int nLineOrig = nLinePre + m_nLineOffset;
	AddGlobalError(true, 101, ex.getErrorMessage(), GrpLineAndFile(nLinePre, nLineOrig, m_staFile));
}